

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O0

uint dmrC_value_size(longlong value)

{
  longlong value_local;
  
  if (value >> 8 == 0) {
    value_local._4_4_ = 8;
  }
  else if (value >> 0x10 == 0) {
    value_local._4_4_ = 0x10;
  }
  else if (value >> 0x20 == 0) {
    value_local._4_4_ = 0x20;
  }
  else {
    value_local._4_4_ = 0x40;
  }
  return value_local._4_4_;
}

Assistant:

unsigned int dmrC_value_size(long long value)
{
	value >>= 8;
	if (!value)
		return 8;
	value >>= 8;
	if (!value)
		return 16;
	value >>= 16;
	if (!value)
		return 32;
	return 64;
}